

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O1

long jpc_bitstream_getbits(jpc_bitstream_t *bitstream,int n)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((uint)n < 0x20) {
    if (n == 0) {
      uVar4 = 0;
    }
    else {
      iVar3 = n + 1;
      uVar4 = 0;
      do {
        if ((bitstream->openmode_ & 1) == 0) {
          __assert_fail("(bitstream)->openmode_ & JPC_BITSTREAM_READ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                        ,0xcc,"long jpc_bitstream_getbits(jpc_bitstream_t *, int)");
        }
        iVar1 = bitstream->cnt_;
        uVar2 = iVar1 - 1;
        bitstream->cnt_ = uVar2;
        if (iVar1 < 1) {
          uVar2 = jpc_bitstream_fillbuf(bitstream);
        }
        else {
          uVar2 = (uint)((bitstream->buf_ >> ((ulong)uVar2 & 0x3f) & 1) != 0);
        }
        if ((int)uVar2 < 0) goto LAB_00118f18;
        uVar4 = uVar4 * 2 | (ulong)uVar2;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
    }
  }
  else {
LAB_00118f18:
    uVar4 = 0xffffffffffffffff;
  }
  return uVar4;
}

Assistant:

long jpc_bitstream_getbits(jpc_bitstream_t *bitstream, int n)
{
	long v;
	int u;

	/* We can reliably get at most 31 bits since ISO/IEC 9899 only
	  guarantees that a long can represent values up to 2^31-1. */
	//assert(n >= 0 && n < 32);
	if (n < 0 || n >= 32) {
		return -1;
	}

	/* Get the number of bits requested from the specified bit stream. */
	v = 0;
	while (--n >= 0) {
		if ((u = jpc_bitstream_getbit(bitstream)) < 0) {
			return -1;
		}
		v = (v << 1) | u;
	}
	return v;
}